

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::TemplatedFetchRow<duckdb::uhugeint_t>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,idx_t row_idx
               ,Vector *result,idx_t result_idx)

{
  undefined8 *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  UndoBufferPointer update_ptr;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  pdVar2 = result->data;
  if (((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
      ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) &&
     ((ulong)info->N != 0)) {
    lVar5 = 0;
    uVar6 = 1;
    do {
      uVar7 = (ulong)*(uint *)((long)&info[1].segment + lVar5);
      if (uVar7 == row_idx) {
        puVar1 = (undefined8 *)((long)&info[1].segment + lVar5 * 4 + (ulong)info->max * 4);
        uVar4 = puVar1[1];
        pdVar3 = pdVar2 + result_idx * 0x10;
        *(undefined8 *)pdVar3 = *puVar1;
        *(undefined8 *)(pdVar3 + 8) = uVar4;
        break;
      }
      if (row_idx <= uVar7 && uVar7 != row_idx) break;
      lVar5 = lVar5 + 4;
      bVar8 = uVar6 < info->N;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  local_68.entry = (info->next).entry;
  local_68.position = (info->next).position;
  if (local_68.entry != (UndoBufferEntry *)0x0) {
    pdVar2 = pdVar2 + result_idx * 0x10;
    do {
      UndoBufferPointer::Pin(&local_58,&local_68);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
      pdVar3 = (local_58.handle.node.ptr)->buffer;
      if (((start_time < *(ulong *)(pdVar3 + local_58.position + 0x10)) &&
          (*(transaction_t *)(pdVar3 + local_58.position + 0x10) != transaction_id)) &&
         ((ulong)*(uint *)(pdVar3 + local_58.position + 0x20) != 0)) {
        lVar5 = 0;
        uVar6 = 1;
        do {
          uVar7 = (ulong)*(uint *)(pdVar3 + lVar5 + local_58.position + 0x48);
          if (uVar7 == row_idx) {
            uVar4 = *(undefined8 *)
                     (pdVar3 + lVar5 * 4 +
                               (ulong)*(uint *)(pdVar3 + local_58.position + 0x24) * 4 +
                               local_58.position + 0x48 + 8);
            *(undefined8 *)pdVar2 =
                 *(undefined8 *)
                  (pdVar3 + lVar5 * 4 +
                            (ulong)*(uint *)(pdVar3 + local_58.position + 0x24) * 4 +
                            local_58.position + 0x48);
            *(undefined8 *)(pdVar2 + 8) = uVar4;
            break;
          }
          if (row_idx <= uVar7 && uVar7 != row_idx) break;
          lVar5 = lVar5 + 4;
          bVar8 = uVar6 < *(uint *)(pdVar3 + local_58.position + 0x20);
          uVar6 = uVar6 + 1;
        } while (bVar8);
      }
      local_68.entry = *(UndoBufferEntry **)(pdVar3 + local_58.position + 0x38);
      local_68.position = *(idx_t *)(pdVar3 + local_58.position + 0x40);
      BufferHandle::~BufferHandle(&local_58.handle);
    } while (local_68.entry != (UndoBufferEntry *)0x0);
  }
  return;
}

Assistant:

static void TemplatedFetchRow(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, idx_t row_idx,
                              Vector &result, idx_t result_idx) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id, [&](UpdateInfo &current) {
		auto info_data = current.GetData<T>();
		auto tuples = current.GetTuples();
		// FIXME: we could do a binary search in here
		for (idx_t i = 0; i < current.N; i++) {
			if (tuples[i] == row_idx) {
				result_data[result_idx] = info_data[i];
				break;
			} else if (tuples[i] > row_idx) {
				break;
			}
		}
	});
}